

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef rec_tnew(jit_State *J,uint32_t ah)

{
  TRef TVar1;
  TRef tr;
  uint32_t hbits;
  uint32_t asize;
  uint32_t ah_local;
  jit_State *J_local;
  
  tr._0_2_ = (IRRef1)(ah & 0x7ff);
  if ((ah & 0x7ff) == 0x7ff) {
    tr._0_2_ = 0x801;
  }
  (J->fold).ins.field_0.ot = 0x518b;
  (J->fold).ins.field_0.op1 = (IRRef1)tr;
  (J->fold).ins.field_0.op2 = (IRRef1)(ah >> 0xb);
  TVar1 = lj_opt_fold(J);
  return TVar1;
}

Assistant:

static TRef rec_tnew(jit_State *J, uint32_t ah)
{
  uint32_t asize = ah & 0x7ff;
  uint32_t hbits = ah >> 11;
  TRef tr;
  if (asize == 0x7ff) asize = 0x801;
  tr = emitir(IRTG(IR_TNEW, IRT_TAB), asize, hbits);
#ifdef LUAJIT_ENABLE_TABLE_BUMP
  J->rbchash[(tr & (RBCHASH_SLOTS-1))].ref = tref_ref(tr);
  setmref(J->rbchash[(tr & (RBCHASH_SLOTS-1))].pc, J->pc);
  setgcref(J->rbchash[(tr & (RBCHASH_SLOTS-1))].pt, obj2gco(J->pt));
#endif
  return tr;
}